

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

bitset_container_t * bitset_container_clone(bitset_container_t *src)

{
  int iVar1;
  uint64_t *in_RAX;
  bitset_container_t *__ptr;
  void *p;
  uint64_t *local_18;
  
  local_18 = in_RAX;
  __ptr = (bitset_container_t *)malloc(0x10);
  if (__ptr != (bitset_container_t *)0x0) {
    iVar1 = posix_memalign(&local_18,0x20,0x2000);
    if (iVar1 != 0) {
      local_18 = (uint64_t *)0x0;
    }
    __ptr->words = local_18;
    if (local_18 != (uint64_t *)0x0) {
      __ptr->cardinality = src->cardinality;
      memcpy(local_18,src->words,0x2000);
      return __ptr;
    }
    free(__ptr);
  }
  return (bitset_container_t *)0x0;
}

Assistant:

bitset_container_t *bitset_container_clone(const bitset_container_t *src) {
    bitset_container_t *bitset =
        (bitset_container_t *)malloc(sizeof(bitset_container_t));

    if (!bitset) {
        return NULL;
    }
    // sizeof(__m256i) == 32
    bitset->words = (uint64_t *)roaring_bitmap_aligned_malloc(
        32, sizeof(uint64_t) * BITSET_CONTAINER_SIZE_IN_WORDS);
    if (!bitset->words) {
        free(bitset);
        return NULL;
    }
    bitset->cardinality = src->cardinality;
    memcpy(bitset->words, src->words,
           sizeof(uint64_t) * BITSET_CONTAINER_SIZE_IN_WORDS);
    return bitset;
}